

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O2

void __thiscall Container::disable_ipcs(Container *this)

{
  allocator<char> local_51;
  string local_50;
  path local_30;
  
  std::filesystem::__cxx11::path::path<char[24],std::filesystem::__cxx11::path>
            (&local_30,(char (*) [24])"/proc/sys/kernel/msgmni",auto_format);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"0",&local_51);
  write_file(&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::filesystem::__cxx11::path::~path(&local_30);
  std::filesystem::__cxx11::path::path<char[24],std::filesystem::__cxx11::path>
            (&local_30,(char (*) [24])"/proc/sys/kernel/shmmni",auto_format);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"0",&local_51);
  write_file(&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::filesystem::__cxx11::path::~path(&local_30);
  std::filesystem::__cxx11::path::path<char[21],std::filesystem::__cxx11::path>
            (&local_30,(char (*) [21])"/proc/sys/kernel/sem",auto_format);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"0 0 0 0",&local_51);
  write_file(&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::filesystem::__cxx11::path::~path(&local_30);
  return;
}

Assistant:

void Container::disable_ipcs() {
    write_file("/proc/sys/kernel/msgmni", "0");
    write_file("/proc/sys/kernel/shmmni", "0");
    write_file("/proc/sys/kernel/sem", "0 0 0 0");
}